

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeString(IMkvReader *pReader,longlong pos,longlong size,char **str)

{
  int iVar1;
  char *pcVar2;
  long status;
  uchar *buf;
  long required_size;
  char **str_local;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if (*str != (char *)0x0) {
    operator_delete__(*str);
  }
  *str = (char *)0x0;
  if (((size < 0x7fffffffffffffff) && (-1 < size)) && (size < 0x1312d01)) {
    pcVar2 = SafeArrayAlloc<char>(1,size + 1);
    *str = pcVar2;
    if (*str == (char *)0x0) {
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
    else {
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size,*str);
      pReader_local = (IMkvReader *)(long)iVar1;
      if (pReader_local == (IMkvReader *)0x0) {
        (*str)[size] = '\0';
        pReader_local = (IMkvReader *)0x0;
      }
      else {
        if (*str != (char *)0x0) {
          operator_delete__(*str);
        }
        *str = (char *)0x0;
      }
    }
  }
  else {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  return (long)pReader_local;
}

Assistant:

long UnserializeString(IMkvReader* pReader, long long pos, long long size,
                       char*& str) {
  delete[] str;
  str = NULL;

  if (size >= LONG_MAX || size < 0 || size > kStringElementSizeLimit)
    return E_FILE_FORMAT_INVALID;

  // +1 for '\0' terminator
  const long required_size = static_cast<long>(size) + 1;

  str = SafeArrayAlloc<char>(1, required_size);
  if (str == NULL)
    return E_FILE_FORMAT_INVALID;

  unsigned char* const buf = reinterpret_cast<unsigned char*>(str);

  const long status = pReader->Read(pos, static_cast<long>(size), buf);

  if (status) {
    delete[] str;
    str = NULL;

    return status;
  }

  str[required_size - 1] = '\0';
  return 0;
}